

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

void __thiscall
Pathie::Path::Path(Path *this,vector<Pathie::Path,_std::allocator<Pathie::Path>_> *components)

{
  bool bVar1;
  string *psVar2;
  size_type sVar3;
  char *pcVar4;
  reference __rhs;
  string local_90 [32];
  Path *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  __normal_iterator<const_Pathie::Path_*,_std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>_>
  local_48;
  __normal_iterator<const_Pathie::Path_*,_std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>_>
  local_40;
  Path *local_38;
  __normal_iterator<const_Pathie::Path_*,_std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>_>
  local_30;
  const_iterator iter;
  vector<Pathie::Path,_std::allocator<Pathie::Path>_> *components_local;
  Path *this_local;
  
  std::__cxx11::string::string((string *)this);
  psVar2 = (string *)std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::front(components);
  std::__cxx11::string::operator=((string *)this,psVar2);
  sVar3 = std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::size(components);
  if (1 < sVar3) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)this);
    if (*pcVar4 != '/') {
      std::__cxx11::string::operator+=((string *)this,"/");
    }
    __gnu_cxx::
    __normal_iterator<const_Pathie::Path_*,_std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>_>
    ::__normal_iterator(&local_30);
    local_40._M_current =
         (Path *)std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::begin(components);
    local_38 = (Path *)__gnu_cxx::
                       __normal_iterator<const_Pathie::Path_*,_std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>_>
                       ::operator+(&local_40,1);
    local_30 = (__normal_iterator<const_Pathie::Path_*,_std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>_>
                )local_38;
    while( true ) {
      local_48._M_current =
           (Path *)std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::end(components);
      bVar1 = __gnu_cxx::operator!=(&local_30,&local_48);
      if (!bVar1) break;
      __rhs = __gnu_cxx::
              __normal_iterator<const_Pathie::Path_*,_std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>_>
              ::operator*(&local_30);
      std::operator+(local_68,(char *)__rhs);
      std::__cxx11::string::operator+=((string *)this,(string *)local_68);
      std::__cxx11::string::~string((string *)local_68);
      local_70 = (Path *)__gnu_cxx::
                         __normal_iterator<const_Pathie::Path_*,_std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>_>
                         ::operator++(&local_30,0);
    }
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_90,(ulong)this);
    std::__cxx11::string::operator=((string *)this,local_90);
    std::__cxx11::string::~string(local_90);
  }
  return;
}

Assistant:

Path::Path(const std::vector<Path>& components)
{
  m_path = components.front().m_path;

  if (components.size() > 1) {
    // Ensure that for both absolute and relative path we end in
    // a slash for appending below
    if (m_path[0] != '/') {
      m_path += "/";
    }

    std::vector<Path>::const_iterator iter;
    for(iter=components.begin()+1; iter != components.end(); iter++) { // first element has already been taken care of above
      m_path += (*iter).m_path + "/";
    }

    // Trailing slash is unwanted, remove it
    m_path = m_path.substr(0, m_path.length()-1);
  }
}